

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
zeGetFabricVertexExpProcAddrTable
          (ze_api_version_t version,ze_fabric_vertex_exp_dditable_t *pDdiTable)

{
  ze_pfnFabricVertexGetSubVerticesExp_t p_Var1;
  ze_pfnFabricVertexGetDeviceExp_t p_Var2;
  ze_api_version_t *pzVar3;
  ze_result_t zVar4;
  
  pzVar3 = validation_layer::context;
  if (pDdiTable == (ze_fabric_vertex_exp_dditable_t *)0x0) {
    zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnGetSubVerticesExp;
      *(ze_pfnFabricVertexGetExp_t *)(validation_layer::context + 0x18a) = pDdiTable->pfnGetExp;
      *(ze_pfnFabricVertexGetSubVerticesExp_t *)(pzVar3 + 0x18c) = p_Var1;
      pDdiTable->pfnGetExp = validation_layer::zeFabricVertexGetExp;
      pDdiTable->pfnGetSubVerticesExp = validation_layer::zeFabricVertexGetSubVerticesExp;
      p_Var2 = pDdiTable->pfnGetDeviceExp;
      *(ze_pfnFabricVertexGetPropertiesExp_t *)(pzVar3 + 0x18e) = pDdiTable->pfnGetPropertiesExp;
      *(ze_pfnFabricVertexGetDeviceExp_t *)(pzVar3 + 400) = p_Var2;
      pDdiTable->pfnGetPropertiesExp = validation_layer::zeFabricVertexGetPropertiesExp;
      pDdiTable->pfnGetDeviceExp = validation_layer::zeFabricVertexGetDeviceExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFabricVertexExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fabric_vertex_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.FabricVertexExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetExp                                   = pDdiTable->pfnGetExp;
    pDdiTable->pfnGetExp                                 = validation_layer::zeFabricVertexGetExp;

    dditable.pfnGetSubVerticesExp                        = pDdiTable->pfnGetSubVerticesExp;
    pDdiTable->pfnGetSubVerticesExp                      = validation_layer::zeFabricVertexGetSubVerticesExp;

    dditable.pfnGetPropertiesExp                         = pDdiTable->pfnGetPropertiesExp;
    pDdiTable->pfnGetPropertiesExp                       = validation_layer::zeFabricVertexGetPropertiesExp;

    dditable.pfnGetDeviceExp                             = pDdiTable->pfnGetDeviceExp;
    pDdiTable->pfnGetDeviceExp                           = validation_layer::zeFabricVertexGetDeviceExp;

    return result;
}